

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btKinematicCharacterController.cpp
# Opt level: O1

void __thiscall
btKinematicCharacterController::playerStep
          (btKinematicCharacterController *this,btCollisionWorld *collisionWorld,btScalar dt)

{
  int *piVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  btPairCachingGhostObject *pbVar5;
  undefined1 auVar6 [12];
  undefined8 uVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  btScalar bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  btVector3 move;
  btTransform xform;
  btVector3 local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  iVar8 = (*(this->super_btCharacterControllerInterface).super_btActionInterface.
            _vptr_btActionInterface[0xc])();
  this->m_wasOnGround = SUB41(iVar8,0);
  getUpAxisDirections();
  fVar16 = (float)*(undefined8 *)getUpAxisDirections::sUpAxisDirection[this->m_upAxis].m_floats;
  fVar17 = (float)((ulong)*(undefined8 *)
                           getUpAxisDirections::sUpAxisDirection[this->m_upAxis].m_floats >> 0x20);
  fVar2 = getUpAxisDirections::sUpAxisDirection[this->m_upAxis].m_floats[2];
  fVar9 = (this->m_walkDirection).m_floats[2] * fVar2 +
          (this->m_walkDirection).m_floats[0] * fVar16 +
          fVar17 * (this->m_walkDirection).m_floats[1] +
          (this->m_verticalVelocity - this->m_gravity * dt);
  this->m_verticalVelocity = fVar9;
  if ((0.0 < fVar9) && (this->m_jumpSpeed < fVar9)) {
    this->m_verticalVelocity = this->m_jumpSpeed;
  }
  if ((this->m_verticalVelocity < 0.0) && (ABS(this->m_fallSpeed) < ABS(this->m_verticalVelocity)))
  {
    this->m_verticalVelocity = -ABS(this->m_fallSpeed);
  }
  uVar4 = *(undefined8 *)(this->m_platformLinearVelocity).m_floats;
  fVar9 = dt * (float)uVar4;
  fVar15 = dt * (float)((ulong)uVar4 >> 0x20);
  fVar18 = (this->m_platformLinearVelocity).m_floats[2] * dt;
  fVar14 = fVar2 * fVar18 + fVar16 * fVar9 + fVar17 * fVar15;
  this->m_verticalOffset = this->m_verticalVelocity * dt + fVar14;
  pbVar5 = this->m_ghostObject;
  local_58 = *(undefined8 *)
              (pbVar5->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_basis.m_el[0]
              .m_floats;
  uStack_50 = *(undefined8 *)
               ((pbVar5->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_basis.m_el
                [0].m_floats + 2);
  local_48 = *(undefined8 *)
              (pbVar5->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_basis.m_el[1]
              .m_floats;
  uStack_40 = *(undefined8 *)
               ((pbVar5->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_basis.m_el
                [1].m_floats + 2);
  local_38 = *(undefined8 *)
              (pbVar5->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_basis.m_el[2]
              .m_floats;
  uStack_30 = *(undefined8 *)
               ((pbVar5->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_basis.m_el
                [2].m_floats + 2);
  local_28 = *(undefined8 *)
              (pbVar5->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_origin.
              m_floats;
  uStack_20 = *(undefined8 *)
               ((pbVar5->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_origin.
                m_floats + 2);
  stepUp(this,collisionWorld);
  if (this->m_useWalkDirection == true) {
    fVar3 = (this->m_walkDirection).m_floats[2];
    uVar4 = *(undefined8 *)(this->m_walkDirection).m_floats;
    fVar11 = (float)uVar4;
    fVar13 = (float)((ulong)uVar4 >> 0x20);
    fVar10 = fVar3 * fVar2 + fVar11 * fVar16 + fVar17 * fVar13;
    auVar6._4_4_ = ((fVar15 - fVar14 * fVar17) + fVar13) - fVar10 * fVar17;
    auVar6._0_4_ = ((fVar9 - fVar14 * fVar16) + fVar11) - fVar10 * fVar16;
    auVar6._8_4_ = ((fVar18 - fVar2 * fVar14) + fVar3) - fVar2 * fVar10;
  }
  else {
    fVar2 = this->m_velocityTimeInterval;
    bVar12 = dt;
    if (fVar2 <= dt) {
      bVar12 = fVar2;
    }
    this->m_velocityTimeInterval = fVar2 - dt;
    uVar4 = *(undefined8 *)(this->m_walkDirection).m_floats;
    auVar6._4_4_ = bVar12 * (float)((ulong)uVar4 >> 0x20);
    auVar6._0_4_ = bVar12 * (float)uVar4;
    auVar6._8_4_ = bVar12 * (this->m_walkDirection).m_floats[2];
  }
  local_68.m_floats[3] = 0.0;
  local_68.m_floats[0] = (btScalar)auVar6._0_4_;
  local_68.m_floats[1] = (btScalar)auVar6._4_4_;
  local_68.m_floats[2] = (btScalar)auVar6._8_4_;
  stepForwardAndStrafe(this,collisionWorld,&local_68);
  stepDown(this,collisionWorld,dt);
  uVar4 = *(undefined8 *)(this->m_currentPosition).m_floats;
  uVar7 = *(undefined8 *)((this->m_currentPosition).m_floats + 2);
  pbVar5 = this->m_ghostObject;
  piVar1 = &(pbVar5->super_btGhostObject).super_btCollisionObject.m_updateRevision;
  *piVar1 = *piVar1 + 1;
  *(undefined8 *)
   (pbVar5->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_basis.m_el[0].m_floats =
       local_58;
  *(undefined8 *)
   ((pbVar5->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_basis.m_el[0].m_floats
   + 2) = uStack_50;
  *(undefined8 *)
   (pbVar5->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_basis.m_el[1].m_floats =
       local_48;
  *(undefined8 *)
   ((pbVar5->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_basis.m_el[1].m_floats
   + 2) = uStack_40;
  *(undefined8 *)
   (pbVar5->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_basis.m_el[2].m_floats =
       local_38;
  *(undefined8 *)
   ((pbVar5->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_basis.m_el[2].m_floats
   + 2) = uStack_30;
  *(undefined8 *)
   (pbVar5->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_origin.m_floats = uVar4;
  *(undefined8 *)
   ((pbVar5->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_origin.m_floats + 2) =
       uVar7;
  return;
}

Assistant:

void btKinematicCharacterController::playerStep (  btCollisionWorld* collisionWorld, btScalar dt)
{
//	printf("playerStep(): ");
//	printf("  dt = %f", dt);

	// quick check...
	if (!m_useWalkDirection && !m_platformLinearVelocity && (m_velocityTimeInterval <= 0.0 || m_walkDirection.fuzzyZero())) {
//		printf("\n");
		return;		// no motion
	}

	m_wasOnGround = onGround();

	// Update fall velocity.
	auto upVector = getUpAxisDirections()[m_upAxis];
	m_verticalVelocity -= m_gravity * dt;
	m_verticalVelocity += upVector.dot(m_walkDirection);
	if(m_verticalVelocity > 0.0 && m_verticalVelocity > m_jumpSpeed)
	{
		m_verticalVelocity = m_jumpSpeed;
	}
	if(m_verticalVelocity < 0.0 && btFabs(m_verticalVelocity) > btFabs(m_fallSpeed))
	{
		m_verticalVelocity = -btFabs(m_fallSpeed);
	}

	//printf("m_platformLinearVelocity %f %f %f: %f\n", m_platformLinearVelocity.x(), m_platformLinearVelocity.y(), m_platformLinearVelocity.z(), dt);
	auto platformStep = m_platformLinearVelocity*dt;
	auto platformVerticalOffset = upVector.dot(platformStep);
	auto platformHorizontalStep = platformStep - platformVerticalOffset*upVector;
	m_verticalOffset = platformVerticalOffset + m_verticalVelocity * dt;

	btTransform xform;
	xform = m_ghostObject->getWorldTransform ();

	//printf("m_useWalkDirection %d walkDirection(%f,%f,%f)\n",m_useWalkDirection, m_walkDirection[0],m_walkDirection[1],m_walkDirection[2]);
	//printf("walkSpeed=%f\n",walkSpeed);

	stepUp (collisionWorld);
	if (m_useWalkDirection) {
		stepForwardAndStrafe (collisionWorld, platformHorizontalStep + m_walkDirection - upVector.dot(m_walkDirection)*upVector);
	} else {
		//printf("  time: %f", m_velocityTimeInterval);
		// still have some time left for moving!
		btScalar dtMoving =
			(dt < m_velocityTimeInterval) ? dt : m_velocityTimeInterval;
		m_velocityTimeInterval -= dt;

		// how far will we move while we are moving?
		btVector3 move = m_walkDirection * dtMoving;

		//printf("  dtMoving: %f", dtMoving);

		// okay, step
		stepForwardAndStrafe(collisionWorld, move);
	}
	stepDown (collisionWorld, dt);

	// printf("\n");

	xform.setOrigin (m_currentPosition);
	m_ghostObject->setWorldTransform (xform);
}